

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void __thiscall Fossilize::FeatureFilter::Impl::init_properties(Impl *this,void *pNext)

{
  VkStructureType VVar1;
  undefined4 uVar2;
  VkPhysicalDeviceVulkan14Properties *vk14;
  VkPhysicalDeviceVulkan13Properties *vk13;
  VkPhysicalDeviceVulkan12Properties *vk12;
  VkPhysicalDeviceVulkan11Properties *vk11;
  VkBaseInStructure *base;
  void *pNext_local;
  Impl *this_local;
  
  for (base = (VkBaseInStructure *)pNext; base != (VkBaseInStructure *)0x0; base = base->pNext) {
    VVar1 = base->sType;
    if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_1_PROPERTIES) {
      (this->props).subgroup.subgroupSize = base[4].sType;
      (this->props).subgroup.supportedStages = *(VkShaderStageFlags *)&base[4].field_0x4;
      (this->props).subgroup.supportedOperations = *(VkSubgroupFeatureFlags *)&base[4].pNext;
      (this->props).subgroup.quadOperationsInAllStages = *(VkBool32 *)((long)&base[4].pNext + 4);
      (this->props).multiview.maxMultiviewViewCount = *(uint32_t *)&base[5].field_0x4;
      (this->props).multiview.maxMultiviewInstanceIndex = *(uint32_t *)&base[5].pNext;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_PROPERTIES) {
      (this->props).float_control.denormBehaviorIndependence =
           *(VkShaderFloatControlsIndependence *)&base[0x21].pNext;
      (this->props).float_control.roundingModeIndependence =
           *(VkShaderFloatControlsIndependence *)((long)&base[0x21].pNext + 4);
      (this->props).float_control.shaderSignedZeroInfNanPreserveFloat16 = base[0x22].sType;
      (this->props).float_control.shaderSignedZeroInfNanPreserveFloat32 =
           *(VkBool32 *)&base[0x22].field_0x4;
      (this->props).float_control.shaderSignedZeroInfNanPreserveFloat64 =
           *(VkBool32 *)&base[0x22].pNext;
      (this->props).float_control.shaderDenormPreserveFloat16 =
           *(VkBool32 *)((long)&base[0x22].pNext + 4);
      (this->props).float_control.shaderDenormPreserveFloat32 = base[0x23].sType;
      (this->props).float_control.shaderDenormPreserveFloat64 = *(VkBool32 *)&base[0x23].field_0x4;
      (this->props).float_control.shaderDenormFlushToZeroFloat16 = *(VkBool32 *)&base[0x23].pNext;
      (this->props).float_control.shaderDenormFlushToZeroFloat32 =
           *(VkBool32 *)((long)&base[0x23].pNext + 4);
      (this->props).float_control.shaderDenormFlushToZeroFloat64 = base[0x24].sType;
      (this->props).float_control.shaderRoundingModeRTEFloat16 = *(VkBool32 *)&base[0x24].field_0x4;
      (this->props).float_control.shaderRoundingModeRTEFloat32 = *(VkBool32 *)&base[0x24].pNext;
      (this->props).float_control.shaderRoundingModeRTEFloat64 =
           *(VkBool32 *)((long)&base[0x24].pNext + 4);
      (this->props).float_control.shaderRoundingModeRTZFloat16 = base[0x25].sType;
      (this->props).float_control.shaderRoundingModeRTZFloat32 = *(VkBool32 *)&base[0x25].field_0x4;
      (this->props).float_control.shaderRoundingModeRTZFloat64 = *(VkBool32 *)&base[0x25].pNext;
      (this->props).descriptor_indexing.maxUpdateAfterBindDescriptorsInAllPools =
           *(uint32_t *)((long)&base[0x25].pNext + 4);
      (this->props).descriptor_indexing.shaderUniformBufferArrayNonUniformIndexingNative =
           base[0x26].sType;
      (this->props).descriptor_indexing.shaderSampledImageArrayNonUniformIndexingNative =
           *(VkBool32 *)&base[0x26].field_0x4;
      (this->props).descriptor_indexing.shaderStorageBufferArrayNonUniformIndexingNative =
           *(VkBool32 *)&base[0x26].pNext;
      (this->props).descriptor_indexing.shaderStorageImageArrayNonUniformIndexingNative =
           *(VkBool32 *)((long)&base[0x26].pNext + 4);
      (this->props).descriptor_indexing.shaderInputAttachmentArrayNonUniformIndexingNative =
           base[0x27].sType;
      (this->props).descriptor_indexing.robustBufferAccessUpdateAfterBind =
           *(VkBool32 *)&base[0x27].field_0x4;
      (this->props).descriptor_indexing.quadDivergentImplicitLod = *(VkBool32 *)&base[0x27].pNext;
      (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindSamplers =
           *(uint32_t *)((long)&base[0x27].pNext + 4);
      (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindUniformBuffers =
           base[0x28].sType;
      (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindStorageBuffers =
           *(uint32_t *)&base[0x28].field_0x4;
      (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindSampledImages =
           *(uint32_t *)&base[0x28].pNext;
      (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindStorageImages =
           *(uint32_t *)((long)&base[0x28].pNext + 4);
      (this->props).descriptor_indexing.maxPerStageDescriptorUpdateAfterBindInputAttachments =
           base[0x29].sType;
      (this->props).descriptor_indexing.maxPerStageUpdateAfterBindResources =
           *(uint32_t *)&base[0x29].field_0x4;
      (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers =
           *(uint32_t *)&base[0x29].pNext;
      (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers =
           *(uint32_t *)((long)&base[0x29].pNext + 4);
      (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffersDynamic =
           base[0x2a].sType;
      (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers =
           *(uint32_t *)&base[0x2a].field_0x4;
      (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffersDynamic =
           *(uint32_t *)&base[0x2a].pNext;
      (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages =
           *(uint32_t *)((long)&base[0x2a].pNext + 4);
      (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageImages =
           base[0x2b].sType;
      (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments =
           *(uint32_t *)&base[0x2b].field_0x4;
      (this->props).ds_resolve.supportedDepthResolveModes = *(VkResolveModeFlags *)&base[0x2b].pNext
      ;
      (this->props).ds_resolve.supportedStencilResolveModes =
           *(VkResolveModeFlags *)((long)&base[0x2b].pNext + 4);
      (this->props).ds_resolve.independentResolveNone = base[0x2c].sType;
      (this->props).ds_resolve.independentResolve = *(VkBool32 *)&base[0x2c].field_0x4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_PROPERTIES) {
      (this->props).subgroup_size_control.minSubgroupSize = base[1].sType;
      (this->props).subgroup_size_control.maxSubgroupSize = *(uint32_t *)&base[1].field_0x4;
      (this->props).subgroup_size_control.maxComputeWorkgroupSubgroups = *(uint32_t *)&base[1].pNext
      ;
      (this->props).subgroup_size_control.requiredSubgroupSizeStages =
           *(VkShaderStageFlags *)((long)&base[1].pNext + 4);
      (this->props).inline_uniform_block.maxInlineUniformBlockSize = base[2].sType;
      (this->props).inline_uniform_block.maxPerStageDescriptorInlineUniformBlocks =
           *(uint32_t *)&base[2].field_0x4;
      (this->props).inline_uniform_block.maxPerStageDescriptorUpdateAfterBindInlineUniformBlocks =
           *(uint32_t *)&base[2].pNext;
      (this->props).inline_uniform_block.maxDescriptorSetInlineUniformBlocks =
           *(uint32_t *)((long)&base[2].pNext + 4);
      (this->props).inline_uniform_block.maxDescriptorSetUpdateAfterBindInlineUniformBlocks =
           base[3].sType;
      (this->props).vk13.maxInlineUniformTotalSize = *(uint32_t *)&base[3].field_0x4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_4_PROPERTIES) {
      (this->props).attribute_divisor.maxVertexAttribDivisor = *(uint32_t *)&base[1].field_0x4;
      (this->props).push_descriptor.maxPushDescriptors = *(uint32_t *)((long)&base[1].pNext + 4);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MULTIVIEW_PROPERTIES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->props).multiview.sType = base->sType;
      *(undefined4 *)&(this->props).multiview.field_0x4 = uVar2;
      (this->props).multiview.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->props).multiview.maxMultiviewViewCount = base[1].sType;
      (this->props).multiview.maxMultiviewInstanceIndex = uVar2;
      (this->props).multiview.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PUSH_DESCRIPTOR_PROPERTIES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->props).push_descriptor.sType = base->sType;
      *(undefined4 *)&(this->props).push_descriptor.field_0x4 = uVar2;
      (this->props).push_descriptor.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->props).push_descriptor.maxPushDescriptors = base[1].sType;
      *(undefined4 *)&(this->props).push_descriptor.field_0x14 = uVar2;
      (this->props).push_descriptor.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBGROUP_PROPERTIES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->props).subgroup.sType = base->sType;
      *(undefined4 *)&(this->props).subgroup.field_0x4 = uVar2;
      (this->props).subgroup.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->props).subgroup.subgroupSize = base[1].sType;
      (this->props).subgroup.supportedStages = uVar2;
      *(VkBaseInStructure **)&(this->props).subgroup.supportedOperations = base[1].pNext;
      (this->props).subgroup.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_INLINE_UNIFORM_BLOCK_PROPERTIES) {
      memcpy(&(this->props).inline_uniform_block,base,0x28);
      (this->props).inline_uniform_block.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SAMPLE_LOCATIONS_PROPERTIES_EXT) {
      memcpy(&(this->props).sample_locations,base,0x30);
      (this->props).sample_locations.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BLEND_OPERATION_ADVANCED_PROPERTIES_EXT) {
      memcpy(&(this->props).blend_operation_advanced,base,0x28);
      (this->props).blend_operation_advanced.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ACCELERATION_STRUCTURE_PROPERTIES_KHR) {
      memcpy(&(this->props).acceleration_structure,base,0x40);
      (this->props).acceleration_structure.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_PROPERTIES) {
      memcpy(&this->props,base,0x70);
      (this->props).descriptor_indexing.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FLOAT_CONTROLS_PROPERTIES) {
      memcpy(&(this->props).float_control,base,0x58);
      (this->props).float_control.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_STENCIL_RESOLVE_PROPERTIES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->props).ds_resolve.sType = base->sType;
      *(undefined4 *)&(this->props).ds_resolve.field_0x4 = uVar2;
      (this->props).ds_resolve.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->props).ds_resolve.supportedDepthResolveModes = base[1].sType;
      (this->props).ds_resolve.supportedStencilResolveModes = uVar2;
      *(VkBaseInStructure **)&(this->props).ds_resolve.independentResolveNone = base[1].pNext;
      (this->props).ds_resolve.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBGROUP_SIZE_CONTROL_PROPERTIES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->props).subgroup_size_control.sType = base->sType;
      *(undefined4 *)&(this->props).subgroup_size_control.field_0x4 = uVar2;
      (this->props).subgroup_size_control.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->props).subgroup_size_control.minSubgroupSize = base[1].sType;
      (this->props).subgroup_size_control.maxSubgroupSize = uVar2;
      *(VkBaseInStructure **)&(this->props).subgroup_size_control.maxComputeWorkgroupSubgroups =
           base[1].pNext;
      (this->props).subgroup_size_control.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_PROPERTIES_KHR) {
      memcpy(&(this->props).fragment_shading_rate,base,0x60);
      (this->props).fragment_shading_rate.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_PROPERTIES_EXT) {
      memcpy(&(this->props).mesh_shader,base,0xa0);
      (this->props).mesh_shader.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_PIPELINE_PROPERTIES_KHR) {
      memcpy(&(this->props).ray_tracing_pipeline,base,0x30);
      (this->props).ray_tracing_pipeline.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_3_PROPERTIES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->props).extended_dynamic_state3.sType = base->sType;
      *(undefined4 *)&(this->props).extended_dynamic_state3.field_0x4 = uVar2;
      (this->props).extended_dynamic_state3.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->props).extended_dynamic_state3.dynamicPrimitiveTopologyUnrestricted = base[1].sType;
      *(undefined4 *)&(this->props).extended_dynamic_state3.field_0x14 = uVar2;
      (this->props).extended_dynamic_state3.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_PROPERTIES_EXT) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->props).shader_module_identifier.sType = base->sType;
      *(undefined4 *)&(this->props).shader_module_identifier.field_0x4 = uVar2;
      (this->props).shader_module_identifier.pNext = base->pNext;
      *(undefined8 *)(this->props).shader_module_identifier.shaderModuleIdentifierAlgorithmUUID =
           *(undefined8 *)(base + 1);
      *(VkBaseInStructure **)
       ((this->props).shader_module_identifier.shaderModuleIdentifierAlgorithmUUID + 8) =
           base[1].pNext;
      (this->props).shader_module_identifier.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VERTEX_ATTRIBUTE_DIVISOR_PROPERTIES) {
      uVar2 = *(undefined4 *)&base->field_0x4;
      (this->props).attribute_divisor.sType = base->sType;
      *(undefined4 *)&(this->props).attribute_divisor.field_0x4 = uVar2;
      (this->props).attribute_divisor.pNext = base->pNext;
      uVar2 = *(undefined4 *)&base[1].field_0x4;
      (this->props).attribute_divisor.maxVertexAttribDivisor = base[1].sType;
      (this->props).attribute_divisor.supportsNonZeroFirstInstance = uVar2;
      (this->props).attribute_divisor.pNext = (void *)0x0;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_7_PROPERTIES_KHR) {
      memcpy(&(this->props).maintenance7,base,0x30);
      (this->props).maintenance7.pNext = (void *)0x0;
    }
  }
  return;
}

Assistant:

void FeatureFilter::Impl::init_properties(const void *pNext)
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);

#define P(struct_type, member, ...) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES: \
		memcpy(&props.member, base, sizeof(props.member)); \
		props.member.pNext = nullptr; \
		break

#define P_CORE(struct_type, member, ...) P(struct_type, member, __VA_ARGS__)

#define PE(struct_type, member, ext) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES_##ext: \
		memcpy(&props.member, base, sizeof(props.member)); \
		props.member.pNext = nullptr; \
		break

#define PE_ALIAS(struct_type, member, ext, ext_alias) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES_##ext: \
		memcpy(&props.member, base, sizeof(props.member)); \
		props.member.pNext = nullptr; \
		break

#define PROP(struct_name, core_struct, prop) props.struct_name.prop = core_struct.prop
		switch (base->sType)
		{
#include "fossilize_feature_filter_properties.inc"

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_1_PROPERTIES:
		{
			auto &vk11 = *reinterpret_cast<const VkPhysicalDeviceVulkan11Properties *>(base);
			PROP(subgroup, vk11, subgroupSize);
			props.subgroup.supportedStages = vk11.subgroupSupportedStages;
			props.subgroup.supportedOperations = vk11.subgroupSupportedOperations;
			props.subgroup.quadOperationsInAllStages = vk11.subgroupQuadOperationsInAllStages;
			//pointClippingBehavior;
			PROP(multiview, vk11, maxMultiviewViewCount);
			PROP(multiview, vk11, maxMultiviewInstanceIndex);
			//protectedNoFault;
			//maxPerSetDescriptors;
			//maxMemoryAllocationSize;
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_PROPERTIES:
		{
			auto &vk12 = *reinterpret_cast<const VkPhysicalDeviceVulkan12Properties *>(base);
			//conformanceVersion;
			PROP(float_control, vk12, denormBehaviorIndependence);
			PROP(float_control, vk12, roundingModeIndependence);
			PROP(float_control, vk12, shaderSignedZeroInfNanPreserveFloat16);
			PROP(float_control, vk12, shaderSignedZeroInfNanPreserveFloat32);
			PROP(float_control, vk12, shaderSignedZeroInfNanPreserveFloat64);
			PROP(float_control, vk12, shaderDenormPreserveFloat16);
			PROP(float_control, vk12, shaderDenormPreserveFloat32);
			PROP(float_control, vk12, shaderDenormPreserveFloat64);
			PROP(float_control, vk12, shaderDenormFlushToZeroFloat16);
			PROP(float_control, vk12, shaderDenormFlushToZeroFloat32);
			PROP(float_control, vk12, shaderDenormFlushToZeroFloat64);
			PROP(float_control, vk12, shaderRoundingModeRTEFloat16);
			PROP(float_control, vk12, shaderRoundingModeRTEFloat32);
			PROP(float_control, vk12, shaderRoundingModeRTEFloat64);
			PROP(float_control, vk12, shaderRoundingModeRTZFloat16);
			PROP(float_control, vk12, shaderRoundingModeRTZFloat32);
			PROP(float_control, vk12, shaderRoundingModeRTZFloat64);
			PROP(descriptor_indexing, vk12, maxUpdateAfterBindDescriptorsInAllPools);
			PROP(descriptor_indexing, vk12, shaderUniformBufferArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, shaderSampledImageArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, shaderStorageBufferArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, shaderStorageImageArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, shaderInputAttachmentArrayNonUniformIndexingNative);
			PROP(descriptor_indexing, vk12, robustBufferAccessUpdateAfterBind);
			PROP(descriptor_indexing, vk12, quadDivergentImplicitLod);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindSamplers);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindUniformBuffers);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindStorageBuffers);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindSampledImages);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindStorageImages);
			PROP(descriptor_indexing, vk12, maxPerStageDescriptorUpdateAfterBindInputAttachments);
			PROP(descriptor_indexing, vk12, maxPerStageUpdateAfterBindResources);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindSamplers);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindUniformBuffers);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindUniformBuffersDynamic);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindStorageBuffers);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindStorageBuffersDynamic);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindSampledImages);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindStorageImages);
			PROP(descriptor_indexing, vk12, maxDescriptorSetUpdateAfterBindInputAttachments);
			PROP(ds_resolve, vk12, supportedDepthResolveModes);
			PROP(ds_resolve, vk12, supportedStencilResolveModes);
			PROP(ds_resolve, vk12, independentResolveNone);
			PROP(ds_resolve, vk12, independentResolve);
			//filterMinmaxSingleComponentFormats;
			//filterMinmaxImageComponentMapping;
			//maxTimelineSemaphoreValueDifference;
			//framebufferIntegerColorSampleCounts;
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_PROPERTIES:
		{
			auto &vk13 = *reinterpret_cast<const VkPhysicalDeviceVulkan13Properties *>(base);
			PROP(subgroup_size_control, vk13, minSubgroupSize);
			PROP(subgroup_size_control, vk13, maxSubgroupSize);
			PROP(subgroup_size_control, vk13, maxComputeWorkgroupSubgroups);
			PROP(subgroup_size_control, vk13, requiredSubgroupSizeStages);
			PROP(inline_uniform_block, vk13, maxInlineUniformBlockSize);
			PROP(inline_uniform_block, vk13, maxPerStageDescriptorInlineUniformBlocks);
			PROP(inline_uniform_block, vk13, maxPerStageDescriptorUpdateAfterBindInlineUniformBlocks);
			PROP(inline_uniform_block, vk13, maxDescriptorSetInlineUniformBlocks);
			PROP(inline_uniform_block, vk13, maxDescriptorSetUpdateAfterBindInlineUniformBlocks);
			PROP(vk13, vk13, maxInlineUniformTotalSize);
			// integer dot product hints
			//storageTexelBufferOffsetAlignmentBytes;
			//storageTexelBufferOffsetSingleTexelAlignment;
			//uniformTexelBufferOffsetAlignmentBytes;
			//uniformTexelBufferOffsetSingleTexelAlignment;
			//maxBufferSize;
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_4_PROPERTIES:
		{
			auto &vk14 = *reinterpret_cast<const VkPhysicalDeviceVulkan14Properties *>(base);
			PROP(attribute_divisor, vk14, maxVertexAttribDivisor);
			PROP(push_descriptor, vk14, maxPushDescriptors);
			break;
		}

		default:
			break;
		}

#undef P
#undef PE
#undef PE_ALIAS
#undef PROP

		pNext = base->pNext;
	}
}